

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

uint64_t __thiscall
llvm::DataExtractor::getULEB128(DataExtractor *this,uint64_t *offset_ptr,Error *Err)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  char *pcVar6;
  uint Shift;
  uint uVar7;
  ulong uVar8;
  ErrorInfoBase *pEVar9;
  ulong uVar10;
  uint8_t *orig_p;
  char *pcVar11;
  error_code EC;
  ulong local_40;
  uint64_t *local_38;
  
  uVar8 = *offset_ptr;
  uVar1 = (this->Data).Length;
  if (uVar1 < uVar8) {
    __assert_fail("*offset_ptr <= Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                  ,0xb0,"uint64_t llvm::DataExtractor::getULEB128(uint64_t *, llvm::Error *) const")
    ;
  }
  if (Err == (Error *)0x0) {
LAB_00d4f92c:
    pcVar6 = (this->Data).Data;
    pcVar11 = (char *)0x0;
    uVar5 = 0;
    uVar7 = 0;
    uVar4 = 0;
    do {
      if (uVar1 - uVar8 == uVar4 && pcVar6 != (char *)0x0) {
        pcVar11 = "malformed uleb128, extends past end";
        uVar5 = 0;
        this = (DataExtractor *)(uVar4 & 0xffffffff);
        goto LAB_00d4f9bd;
      }
      if ((uVar7 < 0x40) &&
         (uVar10 = (ulong)((byte)pcVar6[uVar4 + uVar8] & 0x7f) << ((byte)uVar7 & 0x3f),
         uVar10 >> ((byte)uVar7 & 0x3f) == (ulong)((byte)pcVar6[uVar4 + uVar8] & 0x7f))) {
        uVar5 = uVar5 + uVar10;
        uVar7 = uVar7 + 7;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        this = (DataExtractor *)(uVar4 & 0xffffffff);
        pcVar11 = "uleb128 too big for uint64";
      }
      if (!bVar2) {
        uVar5 = 0;
        goto LAB_00d4f9bd;
      }
      uVar10 = uVar4 + 1;
      lVar3 = uVar4 + uVar8;
      uVar4 = uVar10;
    } while (pcVar6[lVar3] < '\0');
    this = (DataExtractor *)(uVar10 & 0xffffffff);
LAB_00d4f9bd:
    if (pcVar11 == (char *)0x0) {
      *offset_ptr = uVar8 + ((ulong)this & 0xffffffff);
      goto LAB_00d4f9fb;
    }
    if (Err != (Error *)0x0) {
      local_38 = offset_ptr;
      pcVar6 = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = &local_40;
      createStringError(EC,pcVar6);
      Err->Payload = (ErrorInfoBase *)(local_40 | 1);
    }
  }
  else {
    uVar4 = (ulong)Err->Payload & 0xfffffffffffffffe;
    Err->Payload = (ErrorInfoBase *)(uVar4 != 0 | uVar4);
    if (uVar4 == 0) goto LAB_00d4f92c;
  }
  uVar5 = 0;
LAB_00d4f9fb:
  if (Err != (Error *)0x0) {
    uVar8 = (ulong)Err->Payload & 0xfffffffffffffffe;
    pEVar9 = (ErrorInfoBase *)0x1;
    if (uVar8 != 0) {
      pEVar9 = (ErrorInfoBase *)(uVar8 != 0 | uVar8);
    }
    Err->Payload = pEVar9;
  }
  return uVar5;
}

Assistant:

uint64_t DataExtractor::getULEB128(uint64_t *offset_ptr,
                                   llvm::Error *Err) const {
  assert(*offset_ptr <= Data.size());
  ErrorAsOutParameter ErrAsOut(Err);
  if (isError(Err))
    return 0;

  const char *error;
  unsigned bytes_read;
  uint64_t result = decodeULEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error) {
    if (Err)
      *Err = createStringError(errc::illegal_byte_sequence, error);
    return 0;
  }
  *offset_ptr += bytes_read;
  return result;
}